

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

void __thiscall io_buf::buf_write(io_buf *this,char **pointer,size_t n)

{
  char *pcVar1;
  char **ppcVar2;
  char **in_RDX;
  io_buf *in_RSI;
  long *in_RDI;
  size_t in_stack_000001a8;
  v_array<char> *in_stack_000001b0;
  
  if ((ulong)in_RDI[4] < (ulong)(in_RDI[0xc] + (long)in_RDX)) {
    pcVar1 = (char *)in_RDI[0xc];
    ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 2));
    if (pcVar1 == *ppcVar2) {
      v_array<char>::begin((v_array<char> *)(in_RDI + 2));
      v_array<char>::resize(in_stack_000001b0,in_stack_000001a8);
      ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 2));
      pcVar1 = *ppcVar2;
      ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 2));
      *ppcVar2 = pcVar1;
      ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 2));
      in_RDI[0xc] = (long)*ppcVar2;
    }
    else {
      (**(code **)(*in_RDI + 0x38))();
    }
    buf_write(in_RSI,in_RDX,(size_t)in_RDI);
  }
  else {
    in_RSI->_vptr_io_buf = (_func_int **)in_RDI[0xc];
    in_RDI[0xc] = (long)in_RDX + in_RDI[0xc];
  }
  return;
}

Assistant:

void io_buf::buf_write(char*& pointer, size_t n)
{
  // return a pointer to the next n bytes to write into.
  if (head + n <= space.end_array)
  {
    pointer = head;
    head += n;
  }
  else  // Time to dump the file
  {
    if (head != space.begin())
      flush();
    else  // Array is short, so increase size.
    {
      space.resize(2 * (space.end_array - space.begin()));
      space.end() = space.begin();
      head = space.begin();
    }
    buf_write(pointer, n);
  }
}